

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnCatch(SharedValidator *this,Location *loc,Var *tag_var,bool is_catch_all)

{
  Result rhs;
  Var local_b8;
  Enum local_6c;
  undefined1 local_68 [8];
  TagType tag_type;
  undefined1 local_48 [8];
  TypeVector empty;
  bool is_catch_all_local;
  Var *tag_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = is_catch_all;
  Opcode::Opcode((Opcode *)
                 &empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,Catch);
  this_local._4_4_ =
       CheckInstr(this,empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._0_4_,loc);
  if ((empty.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    TagType::TagType((TagType *)local_68);
    Var::Var(&local_b8,tag_var);
    local_6c = (Enum)CheckTagIndex(this,&local_b8,(TagType *)local_68);
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_6c);
    Var::~Var(&local_b8);
    rhs = TypeChecker::OnCatch(&this->typechecker_,(TypeVector *)local_68);
    Result::operator|=((Result *)((long)&this_local + 4),rhs);
    TagType::~TagType((TagType *)local_68);
  }
  else {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_48);
    tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         TypeChecker::OnCatch(&this->typechecker_,(TypeVector *)local_48);
    Result::operator|=((Result *)((long)&this_local + 4),
                       tag_type.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_48);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnCatch(const Location& loc,
                                Var tag_var,
                                bool is_catch_all) {
  Result result = CheckInstr(Opcode::Catch, loc);
  if (is_catch_all) {
    TypeVector empty;
    result |= typechecker_.OnCatch(empty);
  } else {
    TagType tag_type;
    result |= CheckTagIndex(tag_var, &tag_type);
    result |= typechecker_.OnCatch(tag_type.params);
  }
  return result;
}